

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v11::detail::to_pointer<char>(basic_appender<char> it,size_t n)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  ulong count;
  
  sVar2 = (it.container)->size_;
  uVar1 = (it.container)->capacity_;
  count = n + sVar2;
  if (uVar1 < count) {
    (*(it.container)->grow_)(it.container,count);
    sVar2 = (it.container)->size_;
    uVar1 = (it.container)->capacity_;
    count = n + sVar2;
  }
  if (uVar1 < count) {
    pcVar3 = (char *)0x0;
  }
  else {
    buffer<char>::try_resize(it.container,count);
    pcVar3 = (it.container)->ptr_ + sVar2;
  }
  return pcVar3;
}

Assistant:

FMT_CONSTEXPR20 auto to_pointer(basic_appender<T> it, size_t n) -> T* {
  buffer<T>& buf = get_container(it);
  buf.try_reserve(buf.size() + n);
  auto size = buf.size();
  if (buf.capacity() < size + n) return nullptr;
  buf.try_resize(size + n);
  return buf.data() + size;
}